

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::~vector(vector<crnlib::vector<unsigned_int>_> *this)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  void *p;
  long lVar3;
  
  pvVar2 = this->m_p;
  if (pvVar2 != (vector<unsigned_int> *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        p = *(void **)((long)&pvVar2->m_p + lVar3);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar3);
    }
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }